

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O2

void NewObjInGlobal(void)

{
  Function *prototype;
  int iVar1;
  size_type max;
  unsigned_long __n;
  reference ppFVar2;
  uint uVar3;
  Closure *c;
  
  iVar1 = rand();
  if (iVar1 % 100 < 0x14) {
    c = (Closure *)luna::GC::NewTable(&g_gc,GCGen2);
    std::deque<luna::Table*,std::allocator<luna::Table*>>::emplace_back<luna::Table*>
              ((deque<luna::Table*,std::allocator<luna::Table*>> *)&g_globalTable,(Table **)&c);
  }
  else {
    uVar3 = iVar1 % 100 + 1;
    if (uVar3 < 0x33) {
      c = (Closure *)luna::GC::NewString(&g_gc,GCGen2);
      std::deque<luna::String*,std::allocator<luna::String*>>::emplace_back<luna::String*>
                ((deque<luna::String*,std::allocator<luna::String*>> *)&g_globalString,(String **)&c
                );
    }
    else if ((uVar3 < 0x3d) &&
            (g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
      max = std::deque<luna::Function_*,_std::allocator<luna::Function_*>_>::size(&g_globalFunction)
      ;
      __n = RandomNum<unsigned_long>(max);
      ppFVar2 = std::_Deque_iterator<luna::Function_*,_luna::Function_*&,_luna::Function_**>::
                operator[](&g_globalFunction.
                            super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                            _M_impl.super__Deque_impl_data._M_start,__n);
      prototype = *ppFVar2;
      c = luna::GC::NewClosure(&g_gc,GCGen1);
      luna::Closure::SetPrototype(c,prototype);
      std::deque<luna::Closure_*,_std::allocator<luna::Closure_*>_>::push_back(&g_globalClosure,&c);
    }
  }
  return;
}

Assistant:

inline T RandomRange(T min, T max)
{
    return rand() % (max + 1 - min) + min;
}